

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

void test_aes128gcm(void)

{
  int iVar1;
  ptls_cipher_suite_t *ppVar2;
  ptls_cipher_suite_t *ppVar3;
  ptls_aead_context_t *ppVar4;
  size_t enc1len;
  size_t dec1len;
  size_t enc2len;
  size_t dec2len;
  char enc1 [256];
  char dec1 [256];
  char dec2 [256];
  char enc2 [256];
  size_t local_458;
  size_t local_450;
  size_t local_448;
  size_t local_440;
  byte local_438 [256];
  undefined1 local_338 [256];
  undefined1 local_238 [256];
  undefined1 local_138 [264];
  
  ppVar2 = find_aes128gcmsha256(ctx);
  ppVar3 = find_aes128gcmsha256(ctx_peer);
  ppVar4 = ptls_aead_new(ppVar2->aead,ppVar2->hash,1,"01234567890123456789012345678901");
  if (ppVar4 == (ptls_aead_context_t *)0x0) {
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x55,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
  }
  iVar1 = ptls_aead_transform(ppVar4,local_438,&local_458,"hello world",0xb,'\0');
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x57);
  iVar1 = ptls_aead_transform(ppVar4,local_138,&local_448,"good bye, all",0xd,'\0');
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
      0x59);
  (*ppVar4->dispose_crypto)(ppVar4);
  (*ptls_clear_memory)(ppVar4->static_iv,ppVar4->algo->iv_size);
  free(ppVar4);
  ppVar4 = ptls_aead_new(ppVar3->aead,ppVar3->hash,0,"01234567890123456789012345678901");
  if (ppVar4 != (ptls_aead_context_t *)0x0) {
    iVar1 = ptls_aead_transform(ppVar4,local_338,&local_450,local_438,local_458,'\0');
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x60);
    iVar1 = ptls_aead_transform(ppVar4,local_238,&local_440,local_138,local_448,'\0');
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x62);
    (*ppVar4->dispose_crypto)(ppVar4);
    (*ptls_clear_memory)(ppVar4->static_iv,ppVar4->algo->iv_size);
    free(ppVar4);
    _ok((uint)(local_450 == 0xc),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x66);
    iVar1 = bcmp("hello world",local_338,local_450);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x67);
    _ok((uint)(local_440 == 0xe),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x68);
    iVar1 = bcmp("good bye, all",local_238,local_440);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c",
        0x69);
    local_438[0] = local_438[0] ^ 1;
    ppVar4 = ptls_aead_new(ppVar3->aead,ppVar3->hash,0,"01234567890123456789012345678901");
    if (ppVar4 != (ptls_aead_context_t *)0x0) {
      iVar1 = ptls_aead_transform(ppVar4,local_338,&local_450,local_438,local_458,'\0');
      _ok((uint)(iVar1 == 0x14),"%s %d",
          "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
          ,0x70);
      (*ppVar4->dispose_crypto)(ppVar4);
      (*ptls_clear_memory)(ppVar4->static_iv,ppVar4->algo->iv_size);
      free(ppVar4);
      return;
    }
    __assert_fail("c != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                  ,0x6e,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
  }
  __assert_fail("c != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/t/picotls.c"
                ,0x5e,"void test_ciphersuite(ptls_cipher_suite_t *, ptls_cipher_suite_t *)");
}

Assistant:

static void test_aes128gcm(void)
{
    test_ciphersuite(find_aes128gcmsha256(ctx), find_aes128gcmsha256(ctx_peer));
}